

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

int __thiscall QAbstractItemView::sizeHintForRow(QAbstractItemView *this,int row)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  QAbstractItemViewPrivate *this_01;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  QObject *pQVar4;
  long lVar5;
  int iVar6;
  QEditorInfo *pQVar7;
  long *plVar8;
  int extraout_var;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  int local_154;
  QModelIndex local_140;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row) {
    this_01 = *(QAbstractItemViewPrivate **)(this + 8);
    pQVar2 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,this_00);
    iVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&option);
    if (row < iVar6) {
      QWidget::ensurePolished((QWidget *)this);
      memset(&option,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&option);
      (**(code **)(*(long *)this + 0x2f8))(this,&option);
      pQVar2 = this_01->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_128,this_00);
      iVar6 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,(QModelIndex *)&local_128);
      local_154 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      for (iVar10 = 0; iVar6 != iVar10; iVar10 = iVar10 + 1) {
        local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar2 = this_01->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
        (**(code **)(*(long *)pQVar2 + 0x60))
                  ((QModelIndex *)&local_128,pQVar2,row,iVar10,&local_140);
        pQVar7 = QAbstractItemViewPrivate::editorForIndex(this_01,(QModelIndex *)&local_128);
        pDVar3 = (pQVar7->widget).wp.d;
        if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
            (pQVar4 = (pQVar7->widget).wp.value, pQVar4 != (QObject *)0x0)) &&
           (lVar5 = *(long *)(pQVar4 + 0x20),
           iVar9 = (*(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18)) + 1, local_154 <= iVar9)) {
          local_154 = iVar9;
        }
        plVar8 = (long *)(**(code **)(*(long *)this + 0x208))(this,(QModelIndex *)&local_128);
        if ((plVar8 != (long *)0x0) &&
           ((**(code **)(*plVar8 + 0x68))(plVar8,&option,(QModelIndex *)&local_128),
           local_154 <= extraout_var)) {
          local_154 = extraout_var;
        }
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(&option);
      goto LAB_004e7b9c;
    }
  }
  local_154 = -1;
LAB_004e7b9c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_154;
}

Assistant:

int QAbstractItemView::sizeHintForRow(int row) const
{
    Q_D(const QAbstractItemView);

    if (row < 0 || row >= d->model->rowCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int height = 0;
    int colCount = d->model->columnCount(d->root);
    for (int c = 0; c < colCount; ++c) {
        const QModelIndex index = d->model->index(row, c, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            height = qMax(height, editor->height());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            height = qMax(height, delegate->sizeHint(option, index).height());
    }
    return height;
}